

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O2

Info * re2::Prefilter::Info::Concat(Info *a,Info *b)

{
  Info *this;
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (a != (Info *)0x0) {
    if (a->is_exact_ == false) {
      __assert_fail("a->is_exact_",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prefilter.cc"
                    ,0x130,"static Prefilter::Info *re2::Prefilter::Info::Concat(Info *, Info *)");
    }
    if ((b == (Info *)0x0) || (b->is_exact_ == false)) {
      __assert_fail("b && b->is_exact_",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prefilter.cc"
                    ,0x131,"static Prefilter::Info *re2::Prefilter::Info::Concat(Info *, Info *)");
    }
    this = (Info *)operator_new(0x40);
    p_Var1 = &(this->exact_)._M_t._M_impl.super__Rb_tree_header;
    (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (this->exact_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this->is_exact_ = false;
    this->match_ = (Prefilter *)0x0;
    for (p_Var3 = (a->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(a->exact_)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      for (p_Var2 = (b->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var2 != &(b->exact_)._M_t._M_impl.super__Rb_tree_header;
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
        std::operator+(&local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var3 + 1),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var2 + 1));
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    this->is_exact_ = true;
    ~Info(a);
    operator_delete(a);
    ~Info(b);
    operator_delete(b);
    b = this;
  }
  return b;
}

Assistant:

Prefilter::Info* Prefilter::Info::Concat(Info* a, Info* b) {
  if (a == NULL)
    return b;
  DCHECK(a->is_exact_);
  DCHECK(b && b->is_exact_);
  Info *ab = new Info();

  CrossProduct(a->exact_, b->exact_, &ab->exact_);
  ab->is_exact_ = true;

  delete a;
  delete b;
  return ab;
}